

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleMenu::childAt(QAccessibleMenu *this,int x,int y)

{
  char cVar1;
  QMenu *this_00;
  QWidget *pQVar2;
  QAction *action;
  QAccessibleInterface *pQVar3;
  long in_FS_OFFSET;
  QPoint local_40;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar2 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  local_40.xp.m_i = x;
  local_40.yp.m_i = y;
  local_38 = QWidget::mapFromGlobal(pQVar2,&local_40);
  action = QMenu::actionAt(this_00,&local_38);
  if (action != (QAction *)0x0) {
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      pQVar3 = getOrCreateMenu(pQVar2,action);
      goto LAB_00518535;
    }
  }
  pQVar3 = (QAccessibleInterface *)0x0;
LAB_00518535:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenu::childAt(int x, int y) const
{
    QAction *act = menu()->actionAt(menu()->mapFromGlobal(QPoint(x,y)));
    if (act && act->isSeparator())
        act = nullptr;
    return act ? getOrCreateMenu(menu(), act) : nullptr;
}